

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O3

void __thiscall
agge::tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::operator()
          (thread_mapping_blender<unsigned_short,_unsigned_char> *this,unsigned_short *pixels,
          int param_2,int param_3,count_t length,cover_type *covers)

{
  byte bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  mutex *this_01;
  pointer puVar2;
  iterator __position;
  uint uVar3;
  thread_id tVar4;
  ulong uVar5;
  ushort local_4c;
  thread_id local_38;
  
  if (length != 0) {
    do {
      bVar1 = *covers;
      this_00 = this->_mapping;
      this_01 = this->_mtx;
      tVar4 = this_thread_id();
      local_38 = tVar4;
      mutex::lock(this_01);
      puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if ((long)__position._M_current - (long)puVar2 != 0) {
        uVar5 = 0;
        do {
          uVar3 = (uint)uVar5;
          if (tVar4 == puVar2[uVar5]) goto LAB_001751a8;
          uVar5 = (ulong)(byte)((char)uVar5 + 1);
        } while (uVar5 < (ulong)((long)__position._M_current - (long)puVar2 >> 3));
      }
      uVar3 = (uint)((ulong)((long)__position._M_current - (long)puVar2) >> 3) & 0x1fffffff;
      if (__position._M_current ==
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert
                  (this_00,__position,&local_38);
      }
      else {
        *__position._M_current = tVar4;
        (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_001751a8:
      mutex::unlock(this_01);
      local_4c = (ushort)bVar1;
      *pixels = local_4c | (ushort)((uVar3 & 0xff) << 8);
      pixels = pixels + 1;
      covers = covers + 1;
      length = length - 1;
    } while (length != 0);
  }
  return;
}

Assistant:

void operator ()(PixelT *pixels, int /*x*/, int /*y*/, count_t length, const cover_type *covers) const
				{
					for (; length; --length, ++pixels, ++covers)
						*pixels = static_cast<pixel>(static_cast<int>(*covers)
							+ (map_thread(_mapping, _mtx) << sizeof(cover_type) * 8));
				}